

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

string * __thiscall
minja::Parser::consumeToken(Parser *this,string *token,SpaceHandling space_handling)

{
  bool bVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  char *__s;
  long lVar2;
  difference_type __n;
  string *in_RDX;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RSI;
  string *in_RDI;
  CharIterator start;
  difference_type in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  SpaceHandling in_stack_ffffffffffffff4c;
  uint uVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __end;
  undefined1 in_stack_ffffffffffffff80;
  undefined1 uVar4;
  allocator<char> in_stack_ffffffffffffff82;
  byte bVar5;
  undefined4 in_stack_ffffffffffffff84;
  undefined1 local_69 [17];
  string local_58 [32];
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  string *local_18;
  
  local_28 = *(undefined8 *)((allocator<char> *)in_RSI._M_current + 0x20);
  __end._M_current = (char *)in_RDI;
  local_18 = in_RDX;
  consumeSpaces((Parser *)in_stack_ffffffffffffff50._M_current,in_stack_ffffffffffffff4c);
  local_30 = *(undefined8 *)((allocator<char> *)in_RSI._M_current + 0x20);
  local_38 = *(undefined8 *)((allocator<char> *)in_RSI._M_current + 0x18);
  __last._M_current._4_4_ = in_stack_ffffffffffffff4c;
  __last._M_current._0_4_ = in_stack_ffffffffffffff48;
  __s = (char *)std::distance<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                          (in_stack_ffffffffffffff50,__last);
  lVar2 = std::__cxx11::string::size();
  bVar5 = 0;
  uVar4 = false;
  bVar1 = lVar2 <= (long)__s;
  if (bVar1) {
    local_69._9_8_ = *(undefined8 *)((allocator<char> *)in_RSI._M_current + 0x20);
    std::__cxx11::string::size();
    local_69._1_8_ =
         __gnu_cxx::
         __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                     in_stack_ffffffffffffff40);
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::
    string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,in_RSI,
               __end,(allocator<char> *)__rhs);
    bVar5 = 1;
    uVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_RDI,__rhs);
  }
  uVar3 = (uint)(byte)uVar4 << 0x18;
  if ((bVar5 & 1) != 0) {
    std::__cxx11::string::~string(local_58);
  }
  if (bVar1) {
    std::allocator<char>::~allocator((allocator<char> *)local_69);
  }
  if ((uVar3 & 0x1000000) == 0) {
    *(undefined8 *)((allocator<char> *)in_RSI._M_current + 0x20) = local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff84,
                        CONCAT13(bVar5,CONCAT12(in_stack_ffffffffffffff82,
                                                CONCAT11(uVar4,in_stack_ffffffffffffff80)))),__s,
               (allocator<char> *)in_RSI._M_current);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff82);
  }
  else {
    __n = std::__cxx11::string::size();
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator+=((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((allocator<char> *)in_RSI._M_current + 0x20),__n);
    std::__cxx11::string::string((string *)in_RDI,local_18);
  }
  return (string *)__end._M_current;
}

Assistant:

std::string consumeToken(const std::string & token, SpaceHandling space_handling = SpaceHandling::Strip) {
        auto start = it;
        consumeSpaces(space_handling);
        if (std::distance(it, end) >= (int64_t) token.size() && std::string(it, it + token.size()) == token) {
            it += token.size();
            return token;
        }
        it = start;
        return "";
    }